

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object.cpp
# Opt level: O2

void __thiscall
JsonObject_MisplacedComma_Test::JsonObject_MisplacedComma_Test(JsonObject_MisplacedComma_Test *this)

{
  anon_unknown.dwarf_151a55::JsonObject::JsonObject(&this->super_JsonObject);
  (this->super_JsonObject).super_Test._vptr_Test = (_func_int **)&PTR__JsonObject_001ac700;
  return;
}

Assistant:

TEST_F (JsonObject, MisplacedComma) {
    {
        // An object with a trailing comma but with the extension disabled.
        json::parser<json::null_output> p1;
        p1.input (R"({"a":1,})"s).eof ();
        EXPECT_EQ (p1.last_error (), make_error_code (json::error_code::expected_token));
        EXPECT_EQ (p1.coordinate (), (json::coord{8U, 1U}));
    }
    {
        json::parser<json::null_output> p2;
        p2.input (R"({"a":1 "b":1})"s).eof ();
        EXPECT_EQ (p2.last_error (), make_error_code (json::error_code::expected_object_member));
        EXPECT_EQ (p2.coordinate (), (json::coord{8U, 1U}));
    }
    {
        json::parser<json::null_output> p3;
        p3.input (R"({"a":1,,"b":1})"s).eof ();
        EXPECT_EQ (p3.last_error (), make_error_code (json::error_code::expected_token));
        EXPECT_EQ (p3.coordinate (), (json::coord{8U, 1U}));
    }
}